

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

bool __thiscall
FxVMFunctionCall::CheckEmitCast
          (FxVMFunctionCall *this,VMFunctionBuilder *build,bool returnit,ExpEmit *reg)

{
  bool bVar1;
  uint uVar2;
  int opb;
  FxExpression **ppFVar3;
  undefined4 extraout_var;
  ExpEmit EVar4;
  ExpEmit local_74;
  ExpEmit local_6c;
  ExpEmit local_64;
  ExpEmit where;
  undefined1 local_50 [24];
  FxExpression *arg;
  ExpEmit *pEStack_30;
  FName funcname;
  ExpEmit *reg_local;
  bool returnit_local;
  VMFunctionBuilder *build_local;
  FxVMFunctionCall *this_local;
  undefined4 extraout_var_00;
  
  pEStack_30 = reg;
  FName::FName((FName *)((long)&arg + 4),
               (FName *)&(this->Function->super_PSymbol).super_PTypeBase.super_DObject.field_0x24);
  bVar1 = FName::operator==((FName *)((long)&arg + 4),NAME___decorate_internal_int__);
  if (((bVar1) ||
      (bVar1 = FName::operator==((FName *)((long)&arg + 4),NAME___decorate_internal_bool__), bVar1))
     || (bVar1 = FName::operator==((FName *)((long)&arg + 4),NAME___decorate_internal_float__),
        bVar1)) {
    ppFVar3 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                        (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
    local_50._16_8_ = *ppFVar3;
    if (returnit) {
      uVar2 = (*((FxExpression *)local_50._16_8_)->_vptr_FxExpression[3])();
      if (((uVar2 & 1) == 0) ||
         ((bVar1 = FName::operator==((FName *)((long)&arg + 4),NAME___decorate_internal_int__),
          !bVar1 && (bVar1 = FName::operator==((FName *)((long)&arg + 4),
                                               NAME___decorate_internal_bool__), !bVar1)))) {
        local_6c._0_4_ = (*(*(_func_int ***)local_50._16_8_)[9])(local_50._16_8_,build);
        local_6c.Konst = (bool)(char)extraout_var;
        local_6c.Fixed = (bool)(char)((uint)extraout_var >> 8);
        local_6c.Final = (bool)(char)((uint)extraout_var >> 0x10);
        local_6c.Target = (bool)(char)((uint)extraout_var >> 0x18);
        local_64 = local_6c;
        opb = EncodeRegType(local_6c);
        VMFunctionBuilder::Emit(build,0x4e,0x80,opb,(uint)local_64.RegNum);
        ExpEmit::Free(&local_64,build);
      }
      else {
        FxConstant::GetValue((FxConstant *)local_50);
        VMFunctionBuilder::EmitRetInt(build,0,true,local_50._8_4_);
        ExpVal::~ExpVal((ExpVal *)local_50);
      }
      ExpEmit::ExpEmit(&local_74);
      *pEStack_30 = local_74;
      pEStack_30->Final = true;
    }
    else {
      EVar4._0_4_ = (*((FxExpression *)local_50._16_8_)->_vptr_FxExpression[9])
                              (local_50._16_8_,build);
      EVar4.Konst = (bool)(char)extraout_var_00;
      EVar4.Fixed = (bool)(char)((uint)extraout_var_00 >> 8);
      EVar4.Final = (bool)(char)((uint)extraout_var_00 >> 0x10);
      EVar4.Target = (bool)(char)((uint)extraout_var_00 >> 0x18);
      *pEStack_30 = EVar4;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FxVMFunctionCall::CheckEmitCast(VMFunctionBuilder *build, bool returnit, ExpEmit &reg)
{
	FName funcname = Function->SymbolName;
	if (funcname == NAME___decorate_internal_int__ ||
		funcname == NAME___decorate_internal_bool__ ||
		funcname == NAME___decorate_internal_float__)
	{
		FxExpression *arg = ArgList[0];
		if (returnit)
		{
			if (arg->isConstant() &&
				(funcname == NAME___decorate_internal_int__ ||
				 funcname == NAME___decorate_internal_bool__))
			{ // Use immediate version for integers in range
				build->EmitRetInt(0, true, static_cast<FxConstant *>(arg)->GetValue().Int);
			}
			else
			{
				ExpEmit where = arg->Emit(build);
				build->Emit(OP_RET, RET_FINAL, EncodeRegType(where), where.RegNum);
				where.Free(build);
			}
			reg = ExpEmit();
			reg.Final = true;
		}
		else
		{
			reg = arg->Emit(build);
		}
		return true;
	}
	return false;
}